

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib530.c
# Opt level: O0

int test(char *URL)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  CURL *pCVar6;
  long lVar7;
  uint *puVar8;
  char *pcVar9;
  timeval tVar10;
  timeval older;
  timeval older_00;
  int ec_8;
  CURLMcode ec_7;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  uint local_324;
  CURLMcode ec_6;
  int maxfd;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  timeval interval;
  CURLMcode ec_5;
  CURLMcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_170;
  char local_168 [8];
  char target_url [256];
  int local_5c;
  int i;
  CURLM *m;
  int running;
  CURL *curl [4];
  uint local_1c;
  int res;
  char *URL_local;
  
  local_1c = 0;
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    curl[(long)local_5c + -1] = (CURL *)0x0;
  }
  tVar10 = tutil_tvnow();
  _ec_1 = tVar10.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_170 = tVar10.tv_usec;
  tv_test_start.tv_usec = local_170;
  uVar2 = curl_global_init(3);
  pFVar1 = _stderr;
  if (uVar2 != 0) {
    uVar4 = curl_easy_strerror(uVar2);
    fprintf(pFVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
            ,0x2e,(ulong)uVar2,uVar4);
    local_1c = uVar2;
  }
  if (local_1c == 0) {
    lVar5 = curl_multi_init();
    if (lVar5 == 0) {
      fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
              ,0x30);
      local_1c = 0x7b;
    }
    if (local_1c == 0) {
      for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
        pCVar6 = (CURL *)curl_easy_init();
        curl[(long)local_5c + -1] = pCVar6;
        if (pCVar6 == (CURL *)0x0) {
          fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                  ,0x35);
          local_1c = 0x7c;
        }
        if (local_1c != 0) goto LAB_00102bb0;
        sprintf(local_168,"%s%04i",URL,(ulong)(local_5c + 1));
        target_url[0xf7] = '\0';
        uVar2 = curl_easy_setopt(curl[(long)local_5c + -1],0x2712,local_168);
        pFVar1 = _stderr;
        if (uVar2 != 0) {
          uVar4 = curl_easy_strerror(uVar2);
          fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                  ,0x39,(ulong)uVar2,uVar4);
          local_1c = uVar2;
        }
        if (local_1c != 0) goto LAB_00102bb0;
        uVar2 = curl_easy_setopt(curl[(long)local_5c + -1],0x29,1);
        pFVar1 = _stderr;
        if (uVar2 != 0) {
          uVar4 = curl_easy_strerror(uVar2);
          fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                  ,0x3b,(ulong)uVar2,uVar4);
          local_1c = uVar2;
        }
        if (local_1c != 0) goto LAB_00102bb0;
        uVar2 = curl_easy_setopt(curl[(long)local_5c + -1],0x2a,1);
        pFVar1 = _stderr;
        if (uVar2 != 0) {
          uVar4 = curl_easy_strerror(uVar2);
          fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                  ,0x3d,(ulong)uVar2,uVar4);
          local_1c = uVar2;
        }
        if (local_1c != 0) goto LAB_00102bb0;
        uVar2 = curl_multi_add_handle(lVar5,curl[(long)local_5c + -1]);
        pFVar1 = _stderr;
        if (uVar2 != 0) {
          uVar4 = curl_multi_strerror(uVar2);
          fprintf(pFVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                  ,0x3f,(ulong)uVar2,uVar4);
          local_1c = uVar2;
        }
        if (local_1c != 0) goto LAB_00102bb0;
      }
      uVar2 = curl_multi_setopt(lVar5,3,1);
      pFVar1 = _stderr;
      if (uVar2 != 0) {
        uVar4 = curl_multi_strerror(uVar2);
        fprintf(pFVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                ,0x42,(ulong)uVar2,uVar4);
        local_1c = uVar2;
      }
      if (local_1c == 0) {
        fprintf(_stderr,"Start at URL 0\n");
        while( true ) {
          local_324 = 0xffffff9d;
          rd.__fds_bits[0xf] = 1;
          uVar2 = curl_multi_perform(lVar5,(long)&m + 4);
          pFVar1 = _stderr;
          if (uVar2 == 0) {
            if ((int)m._4_4_ < 0) {
              fprintf(_stderr,
                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                      ,0x4e,(ulong)m._4_4_);
              local_1c = 0x7a;
            }
          }
          else {
            uVar4 = curl_multi_strerror(uVar2);
            fprintf(pFVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                    ,0x4e,(ulong)uVar2,uVar4);
            local_1c = uVar2;
          }
          if (local_1c != 0) break;
          tVar10 = tutil_tvnow();
          older.tv_usec = tv_test_start.tv_usec;
          older.tv_sec = tv_test_start.tv_sec;
          lVar7 = tutil_tvdiff(tVar10,older);
          if (60000 < lVar7) {
            fprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                    ,0x50);
            local_1c = 0x7d;
          }
          if ((local_1c != 0) || (m._4_4_ == 0)) break;
          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
            wr.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
          }
          for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
            exc.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
          }
          for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
            (&ec_6 + (ulong)__arr_2._4_4_ * 2)[0] = CURLM_OK;
            (&ec_6 + (ulong)__arr_2._4_4_ * 2)[1] = CURLM_OK;
          }
          uVar2 = curl_multi_fdset(lVar5,wr.__fds_bits + 0xf,exc.__fds_bits + 0xf,&ec_6,&local_324);
          pFVar1 = _stderr;
          if (uVar2 == 0) {
            if ((int)local_324 < -1) {
              fprintf(_stderr,
                      "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                      ,0x59,(ulong)local_324);
              local_1c = 0x7a;
            }
          }
          else {
            uVar4 = curl_multi_strerror(uVar2);
            fprintf(pFVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                    ,0x59,(ulong)uVar2,uVar4);
            local_1c = uVar2;
          }
          if (local_1c != 0) break;
          iVar3 = select_wrapper(local_324 + 1,(fd_set *)(wr.__fds_bits + 0xf),
                                 (fd_set *)(exc.__fds_bits + 0xf),(fd_set *)&ec_6,
                                 (timeval *)(rd.__fds_bits + 0xf));
          if (iVar3 == -1) {
            puVar8 = (uint *)__errno_location();
            pFVar1 = _stderr;
            uVar2 = *puVar8;
            pcVar9 = strerror(uVar2);
            fprintf(pFVar1,"%s:%d select() failed, with errno %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                    ,0x5d,(ulong)uVar2,pcVar9);
            local_1c = 0x79;
          }
          if (local_1c != 0) break;
          tVar10 = tutil_tvnow();
          older_00.tv_usec = tv_test_start.tv_usec;
          older_00.tv_sec = tv_test_start.tv_sec;
          lVar7 = tutil_tvdiff(tVar10,older_00);
          if (60000 < lVar7) {
            fprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                    ,0x5f);
            local_1c = 0x7d;
          }
          if (local_1c != 0) break;
        }
      }
    }
LAB_00102bb0:
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      curl_multi_remove_handle(lVar5,curl[(long)local_5c + -1]);
      curl_easy_cleanup(curl[(long)local_5c + -1]);
    }
    curl_multi_cleanup(lVar5);
    curl_global_cleanup();
    URL_local._4_4_ = local_1c;
  }
  else {
    URL_local._4_4_ = local_1c;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];

  for(i=0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  /* get NUM_HANDLES easy handles */
  for(i=0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    sprintf(target_url, "%s%04i", URL, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);
    /* add handle to multi */
    multi_add_handle(m, curl[i]);
  }

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i=0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}